

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.h
# Opt level: O2

void __thiscall TGAColor::TGAColor(TGAColor *this,uchar *p,uchar bpp)

{
  int i;
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000011;
  
  this->bgra[0] = '\0';
  this->bgra[1] = '\0';
  this->bgra[2] = '\0';
  this->bgra[3] = '\0';
  this->bytespp = bpp;
  uVar1 = (ulong)CONCAT31(in_register_00000011,bpp);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    this->bgra[uVar2] = p[uVar2];
  }
  for (; uVar1 < 4; uVar1 = uVar1 + 1) {
    this->bgra[uVar1] = '\0';
  }
  return;
}

Assistant:

TGAColor(const unsigned char *p, unsigned char bpp) : bgra(), bytespp(bpp) {
        for (int i=0; i<(int)bpp; i++) {
            bgra[i] = p[i];
        }
        for (int i=bpp; i<4; i++) {
            bgra[i] = 0;
        }
    }